

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall
ClipperLib::Clipper::CheckHoleLinkages2(Clipper *this,OutRec *outRec1,OutRec *outRec2)

{
  size_type sVar1;
  reference ppOVar2;
  ulong local_28;
  size_type i;
  OutRec *outRec2_local;
  OutRec *outRec1_local;
  Clipper *this_local;
  
  local_28 = 0;
  while( true ) {
    sVar1 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::size
                      (&this->m_PolyOuts);
    if (sVar1 <= local_28) break;
    ppOVar2 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                        (&this->m_PolyOuts,local_28);
    if (((*ppOVar2)->isHole & 1U) != 0) {
      ppOVar2 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                          (&this->m_PolyOuts,local_28);
      if ((*ppOVar2)->bottomPt != (OutPt *)0x0) {
        ppOVar2 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::
                  operator[](&this->m_PolyOuts,local_28);
        if ((*ppOVar2)->FirstLeft == outRec2) {
          ppOVar2 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::
                    operator[](&this->m_PolyOuts,local_28);
          (*ppOVar2)->FirstLeft = outRec1;
        }
      }
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void Clipper::CheckHoleLinkages2(OutRec *outRec1, OutRec *outRec2)
{
  //if a hole is owned by outRec2 then make it owned by outRec1 ...
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
    if (m_PolyOuts[i]->isHole && m_PolyOuts[i]->bottomPt &&
      m_PolyOuts[i]->FirstLeft == outRec2)
        m_PolyOuts[i]->FirstLeft = outRec1;
}